

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QFileSystemEntry *
QFileSystemEngine::getRawLinkPath
          (QFileSystemEntry *__return_storage_ptr__,QFileSystemEntry *link,QFileSystemMetaData *data
          )

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath((NativePath *)&local_68,link);
  if (local_68.ptr == (char16_t *)0x0) {
    local_68.ptr = (char16_t *)&QByteArray::_empty;
  }
  qt_readlink((QByteArray *)&local_48,(char *)local_68.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::fromLocal8Bit<void>((QString *)&local_68,(QByteArray *)&local_48);
  QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,(QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::getRawLinkPath(const QFileSystemEntry &link,
                                                   QFileSystemMetaData &data)
{
    Q_UNUSED(data)
    const QByteArray path = qt_readlink(link.nativeFilePath().constData());
    const QString ret = QFile::decodeName(path);
    return QFileSystemEntry(ret);
}